

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_disconnect_now(ENetPeer *peer,enet_uint32 data)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  long in_RDI;
  ENetProtocol command;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined1 uVar3;
  undefined2 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc6;
  undefined6 in_stack_ffffffffffffffca;
  ENetProtocol *in_stack_ffffffffffffffd0;
  ENetPeer *in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 0x38) != 0) {
    if ((*(int *)(in_RDI + 0x38) != 9) && (*(int *)(in_RDI + 0x38) != 7)) {
      enet_peer_reset_queues
                ((ENetPeer *)
                 CONCAT26(in_stack_ffffffffffffffc6,
                          CONCAT24(in_stack_ffffffffffffffc4,
                                   CONCAT13(in_stack_ffffffffffffffc3,
                                            CONCAT12(in_stack_ffffffffffffffc2,
                                                     in_stack_ffffffffffffffc0)))));
      uVar2 = 0x44;
      uVar3 = 0xff;
      uVar1 = htonl(in_ESI);
      enet_peer_queue_outgoing_command
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 (ENetPacket *)CONCAT62(in_stack_ffffffffffffffca,(short)(uVar1 >> 0x10)),
                 CONCAT22((short)uVar1,in_stack_ffffffffffffffc4),CONCAT11(uVar3,uVar2));
      enet_host_flush((ENetHost *)0x107778);
    }
    enet_peer_reset((ENetPeer *)0x107782);
  }
  return;
}

Assistant:

void
enet_peer_disconnect_now (ENetPeer * peer, enet_uint32 data)
{
    ENetProtocol command;

    if (peer -> state == ENET_PEER_STATE_DISCONNECTED)
      return;

    if (peer -> state != ENET_PEER_STATE_ZOMBIE &&
        peer -> state != ENET_PEER_STATE_DISCONNECTING)
    {
        enet_peer_reset_queues (peer);

        command.header.command = ENET_PROTOCOL_COMMAND_DISCONNECT | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
        command.header.channelID = 0xFF;
        command.disconnect.data = ENET_HOST_TO_NET_32 (data);

        enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);

        enet_host_flush (peer -> host);
    }

    enet_peer_reset (peer);
}